

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * Matrix::multiply(double *x1,size_t x1Length,double *x2,size_t x2Length)

{
  Matrix *this;
  ulong local_60;
  size_t k;
  double sum;
  size_t j;
  size_t i;
  Matrix *matrix;
  size_t x2Length_local;
  double *x2_local;
  size_t x1Length_local;
  double *x1_local;
  
  this = (Matrix *)operator_new(0x18);
  Matrix(this,x1Length,x2Length,false);
  for (j = 0; j < x1Length; j = j + 1) {
    for (sum = 0.0; (ulong)sum < x2Length; sum = (double)((long)sum + 1)) {
      k = 0;
      for (local_60 = 0; local_60 < x2Length; local_60 = local_60 + 1) {
        k = (size_t)(x1[j] * x2[local_60] + (double)k);
      }
      this->data[j * x2Length + (long)sum] = (double)k;
    }
  }
  return this;
}

Assistant:

Matrix* Matrix::multiply(double* x1, size_t x1Length, double* x2, size_t x2Length) {
	if (1 != 1) {
		std::cout << "Cols don't match rows" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(x1Length, x2Length);
	for (size_t i = 0; i < x1Length; i++) {
		for (size_t j = 0; j < x2Length; j++) {
			double sum = 0;
			for (size_t k = 0; k < x2Length; ++k) {
				sum += x1[i] * x2[k];
			}
			matrix->data[i * x2Length + j] = sum;
		}
	}
	return matrix;
}